

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars)

{
  XMLCh XVar1;
  undefined1 *puVar2;
  XMLCh *pXVar3;
  XMLCh XVar4;
  long lVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  bool bVar8;
  
  pXVar3 = this->fMsgDomain;
  if (pXVar3 == L"http://apache.org/xml/messages/XMLErrors") {
LAB_00349b28:
    if (0x120 < msgToLoad) {
      return false;
    }
    lVar5 = (ulong)(msgToLoad - 1) << 8;
    puVar2 = gXMLErrArray;
    goto LAB_00349c0f;
  }
  pXVar6 = L"http://apache.org/xml/messages/XMLErrors";
  pXVar7 = pXVar3;
  if (pXVar3 == (XMLCh *)0x0) {
LAB_00349ae9:
    if (*pXVar6 == L'\0') goto LAB_00349b28;
  }
  else {
    do {
      XVar4 = *pXVar7;
      if (XVar4 == L'\0') goto LAB_00349ae9;
      XVar1 = *pXVar6;
      pXVar6 = pXVar6 + 1;
      pXVar7 = pXVar7 + 1;
    } while (XVar4 == XVar1);
  }
  if (pXVar3 == L"http://apache.org/xml/messages/XML4CErrors") {
LAB_00349b81:
    if (0x171 < msgToLoad) {
      return false;
    }
    lVar5 = (ulong)(msgToLoad - 1) << 8;
    puVar2 = gXMLExceptArray;
    goto LAB_00349c0f;
  }
  pXVar6 = L"http://apache.org/xml/messages/XML4CErrors";
  pXVar7 = pXVar3;
  if (pXVar3 == (XMLCh *)0x0) {
LAB_00349b46:
    if (*pXVar6 == L'\0') goto LAB_00349b81;
  }
  else {
    do {
      XVar4 = *pXVar7;
      if (XVar4 == L'\0') goto LAB_00349b46;
      XVar1 = *pXVar6;
      pXVar6 = pXVar6 + 1;
      pXVar7 = pXVar7 + 1;
    } while (XVar4 == XVar1);
  }
  if (pXVar3 == L"http://apache.org/xml/messages/XMLValidity") {
LAB_00349bd2:
    if (msgToLoad < 0x55) {
      lVar5 = (ulong)(msgToLoad - 1) << 8;
      puVar2 = gXMLValidityArray;
LAB_00349c0f:
      pXVar3 = (XMLCh *)(puVar2 + lVar5);
      XVar4 = *pXVar3;
      if (0 < (long)maxChars && XVar4 != L'\0') {
        pXVar6 = toFill + maxChars;
        do {
          pXVar3 = pXVar3 + 1;
          *toFill = XVar4;
          toFill = toFill + 1;
          XVar4 = *pXVar3;
          if (XVar4 == L'\0') break;
        } while (toFill < pXVar6);
      }
      *toFill = L'\0';
      return true;
    }
  }
  else {
    pXVar6 = L"http://apache.org/xml/messages/XMLValidity";
    pXVar7 = pXVar3;
    if (pXVar3 == (XMLCh *)0x0) {
LAB_00349b98:
      if (*pXVar6 == L'\0') goto LAB_00349bd2;
    }
    else {
      do {
        XVar4 = *pXVar7;
        if (XVar4 == L'\0') goto LAB_00349b98;
        XVar1 = *pXVar6;
        pXVar6 = pXVar6 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar4 == XVar1);
    }
    if (pXVar3 == L"http://apache.org/xml/messages/XMLDOMMsg") {
      bVar8 = true;
    }
    else {
      pXVar6 = L"http://apache.org/xml/messages/XMLDOMMsg";
      if (pXVar3 == (XMLCh *)0x0) {
LAB_00349be9:
        bVar8 = *pXVar6 == L'\0';
      }
      else {
        do {
          XVar4 = *pXVar3;
          if (XVar4 == L'\0') goto LAB_00349be9;
          pXVar3 = pXVar3 + 1;
          XVar1 = *pXVar6;
          pXVar6 = pXVar6 + 1;
        } while (XVar4 == XVar1);
        bVar8 = false;
      }
    }
    if ((msgToLoad < 0x2a) && (bVar8)) {
      lVar5 = (ulong)(msgToLoad - 1) << 8;
      puVar2 = gXMLDOMMsgArray;
      goto LAB_00349c0f;
    }
  }
  return false;
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars)
{
    //
    //  Just use the id to map into the correct array of messages. Then
    //  copy that to the caller's buffer.
    //
    //  NOTE:   The source text is in little endian form. So, if we are a
    //          big endian machine, flip them in the process.
    //
    XMLCh* endPtr = toFill + maxChars;
    XMLCh* outPtr = toFill;
    const XMLCh* srcPtr = 0;

    if (XMLString::equals(fMsgDomain, XMLUni::fgXMLErrDomain))
    {
        if ( msgToLoad > gXMLErrArraySize)
            return false;
        else
            srcPtr = gXMLErrArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgExceptDomain))
    {
         if ( msgToLoad > gXMLExceptArraySize)
            return false;
         else
             srcPtr = gXMLExceptArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgValidityDomain))
    {
         if ( msgToLoad > gXMLValidityArraySize)
            return false;
         else
             srcPtr = gXMLValidityArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgXMLDOMMsgDomain))
    {
         if ( msgToLoad > gXMLDOMMsgArraySize)
            return false;
         else
             srcPtr = gXMLDOMMsgArray[msgToLoad - 1];
    } else {
	return false;
    }

     while (*srcPtr && (outPtr < endPtr))
     {
         *outPtr++ = *srcPtr++;
     }
     *outPtr = 0;

     return true;
}